

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_rb_seek_write(ma_rb *pRB,size_t offsetInBytes)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  if (pRB != (ma_rb *)0x0) {
    uVar4 = pRB->encodedReadOffset & 0x80000000;
    uVar1 = pRB->encodedWriteOffset & 0x7fffffff;
    uVar3 = pRB->encodedWriteOffset & 0x80000000;
    if (uVar4 == uVar3) {
      uVar2 = uVar1 + offsetInBytes;
      if (pRB->subbufferSizeInBytes <= uVar2) {
        uVar2 = (ulong)((int)uVar2 - pRB->subbufferSizeInBytes);
        uVar4 = uVar4 + 0x80000000;
      }
      uVar3 = uVar4;
      uVar1 = (uint)uVar2;
    }
    else {
      uVar4 = pRB->encodedReadOffset & 0x7fffffff;
      uVar2 = uVar1 + offsetInBytes;
      uVar1 = (uint)uVar2;
      if (uVar4 < uVar2) {
        uVar1 = uVar4;
      }
    }
    LOCK();
    pRB->encodedWriteOffset = uVar3 | uVar1;
    UNLOCK();
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_rb_seek_write(ma_rb* pRB, size_t offsetInBytes)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 newWriteOffsetInBytes;
    ma_uint32 newWriteOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = ma_atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    newWriteOffsetLoopFlag = writeOffsetLoopFlag;

    /* We cannot go past the write buffer. */
    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        /* May end up looping. */
        if ((writeOffsetInBytes + offsetInBytes) >= pRB->subbufferSizeInBytes) {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes) - pRB->subbufferSizeInBytes;
            newWriteOffsetLoopFlag ^= 0x80000000;    /* <-- Looped. */
        } else {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes);
        }
    } else {
        if ((writeOffsetInBytes + offsetInBytes) > readOffsetInBytes) {
            newWriteOffsetInBytes = readOffsetInBytes;
        } else {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes);
        }
    }

    ma_atomic_exchange_32(&pRB->encodedWriteOffset, ma_rb__construct_offset(newWriteOffsetInBytes, newWriteOffsetLoopFlag));
    return MA_SUCCESS;
}